

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString::Builder<256u>>
               (char16 *s,CharCount appendCharLength,Builder<256U> *toString)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  uint uVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  
  if (s == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x39e,"(s)","s");
    if (!bVar3) goto LAB_00d1e5ac;
    *puVar6 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x39f,"(toString)","toString");
    if (!bVar3) goto LAB_00d1e5ac;
    *puVar6 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3a0,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00d1e5ac;
    *puVar6 = 0;
  }
  if (toString->directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3a2,"(toString->HasOnlyDirectChars())",
                                "toString->HasOnlyDirectChars()");
    if (!bVar3) {
LAB_00d1e5ac:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar1 = toString->charLength;
  CVar4 = Block::CharCapacityFromPointerCapacity(0x40);
  if (appendCharLength <= CVar4 - uVar1) {
    pcVar7 = Block::Chars(toString);
    JavascriptString::CopyHelper(pcVar7 + uVar1,s,appendCharLength);
    uVar5 = toString->stringLength + appendCharLength;
    if (0x7ffffffe < uVar5) {
      Throw::OutOfMemory();
    }
    toString->stringLength = uVar5;
    toString->charLength = uVar1 + appendCharLength;
  }
  return appendCharLength <= CVar4 - uVar1;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        __in_xcount(appendCharLength) const char16 *const s,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(toString->HasOnlyDirectChars());

        const CharCount blockCharLength = toString->LastBlockCharLength();
        if(appendCharLength <= toString->LastBlockCharCapacity() - blockCharLength)
        {
            CopyHelper(&toString->LastBlockChars()[blockCharLength], s, appendCharLength);
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockCharLength(blockCharLength + appendCharLength);
            return true;
        }
        return false;
    }